

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

bool __thiscall
TMapIterator<FString,_int,_TMap<FString,_int,_THashTraits<FString>,_TValueTraits<int>_>_>::NextPair
          (TMapIterator<FString,_int,_TMap<FString,_int,_THashTraits<FString>,_TValueTraits<int>_>_>
           *this,Pair **pair)

{
  bool bVar1;
  uint uVar2;
  Pair **pair_local;
  TMapIterator<FString,_int,_TMap<FString,_int,_THashTraits<FString>,_TValueTraits<int>_>_>
  *this_local;
  
  if (this->Position < this->Map->Size) {
    do {
      bVar1 = TMap<FString,_int,_THashTraits<FString>,_TValueTraits<int>_>::Node::IsNil
                        (this->Map->Nodes + this->Position);
      if (!bVar1) {
        *pair = (Pair *)&this->Map->Nodes[this->Position].Pair;
        this->Position = this->Position + 1;
        return true;
      }
      uVar2 = this->Position + 1;
      this->Position = uVar2;
    } while (uVar2 < this->Map->Size);
  }
  return false;
}

Assistant:

bool NextPair(typename MapType::Pair *&pair)
	{
		if (Position >= Map.Size)
		{
			return false;
		}
		do
		{
			if (!Map.Nodes[Position].IsNil())
			{
				pair = reinterpret_cast<typename MapType::Pair *>(&Map.Nodes[Position].Pair);
				Position += 1;
				return true;
			}
		} while (++Position < Map.Size);
		return false;
	}